

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
google::protobuf::Split_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,protobuf *this,StringPiece full,char *delim,bool skip_empty)

{
  StringPiece full_00;
  StringPiece full_01;
  bool skip_empty_local;
  char *delim_local;
  StringPiece full_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  if (((ulong)delim & 1) == 0) {
    full_00.length_ = (size_type)full.ptr_;
    full_00.ptr_ = (char *)this;
    SplitStringAllowEmpty(full_00,(char *)full.length_,__return_storage_ptr__);
  }
  else {
    full_01.length_ = (size_type)full.ptr_;
    full_01.ptr_ = (char *)this;
    SplitStringUsing(full_01,(char *)full.length_,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> Split(StringPiece full, const char* delim,
                                      bool skip_empty = true) {
  std::vector<std::string> result;
  if (skip_empty) {
    SplitStringUsing(full, delim, &result);
  } else {
    SplitStringAllowEmpty(full, delim, &result);
  }
  return result;
}